

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_MethodNameError_Test::
ParserValidationErrorTest_MethodNameError_Test(ParserValidationErrorTest_MethodNameError_Test *this)

{
  ParserValidationErrorTest_MethodNameError_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParserValidationErrorTest);
  (this->super_ParserValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserValidationErrorTest_MethodNameError_Test_02a0fc78;
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, MethodNameError) {
  ExpectHasValidationErrors(
      "message Baz {}\n"
      "service Foo {\n"
      "  rpc Bar(Baz) returns(Baz);\n"
      "  rpc Bar(Baz) returns(Baz);\n"
      "}\n",
      "3:6: \"Bar\" is already defined in \"Foo\".\n");
}